

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

Vertex __thiscall embree::OBJLoader::getUInt3(OBJLoader *this,char **token)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  Vertex VVar9;
  
  pcVar1 = *token;
  iVar2 = atoi(pcVar1);
  if (iVar2 < 1) {
    if (iVar2 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = iVar2 + (int)(this->v).size_active;
    }
  }
  else {
    uVar5 = iVar2 - 1;
  }
  sVar4 = strcspn(pcVar1,"/ \t\r");
  pcVar8 = pcVar1 + sVar4;
  *token = pcVar8;
  uVar6 = 0xffffffff;
  if (pcVar1[sVar4] != '/') {
    uVar7 = 0xffffffff;
    goto LAB_00137815;
  }
  pcVar1 = pcVar8 + 1;
  *token = pcVar1;
  if (pcVar8[1] == '/') {
    pcVar8 = pcVar8 + 2;
    *token = pcVar8;
    iVar2 = atoi(pcVar8);
    if (iVar2 < 1) {
      uVar7 = 0xffffffffffffffff;
joined_r0x001377fc:
      if (iVar2 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = iVar2 + (int)(this->vn).size_active;
      }
    }
    else {
      uVar6 = iVar2 - 1;
      uVar7 = 0xffffffffffffffff;
    }
  }
  else {
    iVar2 = atoi(pcVar1);
    uVar3 = fix_vt(this,iVar2);
    uVar7 = (ulong)uVar3;
    sVar4 = strcspn(pcVar1,"/ \t\r");
    *token = pcVar1 + sVar4;
    if (pcVar1[sVar4] != '/') goto LAB_00137815;
    pcVar8 = pcVar1 + sVar4 + 1;
    *token = pcVar8;
    iVar2 = atoi(pcVar8);
    if (iVar2 < 1) goto joined_r0x001377fc;
    uVar6 = iVar2 - 1;
  }
  sVar4 = strcspn(pcVar8," \t\r");
  *token = pcVar8 + sVar4;
LAB_00137815:
  VVar9._0_8_ = (ulong)uVar5 | uVar7 << 0x20;
  VVar9.vn = uVar6;
  return VVar9;
}

Assistant:

Vertex OBJLoader::getUInt3(const char*& token)
  {
    Vertex v(-1);
    v.v = fix_v(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i//n
    if (token[0] == '/') {
      token++;
      v.vn = fix_vn(atoi(token));
      token += strcspn(token, " \t\r");
      return(v);
    }

    // it is i/t/n or i/t
    v.vt = fix_vt(atoi(token));
    token += strcspn(token, "/ \t\r");
    if (token[0] != '/') return(v);
    token++;

    // it is i/t/n
    v.vn = fix_vn(atoi(token));
    token += strcspn(token, " \t\r");
    return(v);
  }